

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ffrecord.c
# Opt level: O1

TRef recff_tmpref(jit_State *J,TRef tr,int mode)

{
  TRef TVar1;
  
  if ((tr >> 0x18 & 0x1f) - 0xf < 5) {
    (J->fold).ins.field_0.op1 = (IRRef1)tr;
    *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x5b0e01d3;
    tr = lj_opt_fold(J);
  }
  (J->fold).ins.field_0.ot = 0x3f09;
  (J->fold).ins.field_0.op1 = (IRRef1)tr;
  (J->fold).ins.field_0.op2 = (IRRef1)mode;
  TVar1 = lj_opt_fold(J);
  return TVar1;
}

Assistant:

static TRef recff_tmpref(jit_State *J, TRef tr, int mode)
{
  if (!LJ_DUALNUM && tref_isinteger(tr))
    tr = emitir(IRTN(IR_CONV), tr, IRCONV_NUM_INT);
  return emitir(IRT(IR_TMPREF, IRT_PGC), tr, mode);
}